

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# halfedge.cpp
# Opt level: O2

bool __thiscall
graphics101::HalfEdgeTriMesh::vertex_is_boundary(HalfEdgeTriMesh *this,Index vertex_index)

{
  HalfEdgeIndex __n;
  const_reference pvVar1;
  
  __n = outgoing_halfedge_index_for_vertex(this,vertex_index);
  pvVar1 = std::
           vector<graphics101::HalfEdgeTriMesh::HalfEdge,_std::allocator<graphics101::HalfEdgeTriMesh::HalfEdge>_>
           ::at(&this->m_halfedges,__n.value);
  return pvVar1->face == -1;
}

Assistant:

bool HalfEdgeTriMesh::vertex_is_boundary( const Index vertex_index ) const
{
    return -1 == halfedge( outgoing_halfedge_index_for_vertex( vertex_index ) ).face;
}